

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cc
# Opt level: O3

string * __thiscall
ipx::StatusString_abi_cxx11_(string *__return_storage_ptr__,ipx *this,Int status)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int iVar6;
  long lVar7;
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  status_name;
  allocator_type local_2aa;
  less<int> local_2a9;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  undefined1 local_278 [8];
  _Alloc_hider local_270;
  char local_260 [16];
  undefined4 local_250;
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined4 local_200;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined4 local_1d8;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined4 local_1b0;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined4 local_188;
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined4 local_160;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined4 local_138;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined4 local_110;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined4 local_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined4 local_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined4 local_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_278._0_4_ = 0;
  local_270._M_p = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"not run","");
  local_250 = 1000;
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"solved","");
  local_228 = 0x3ed;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"stopped","");
  local_200 = 0x3ee;
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"no model","");
  local_1d8 = 0x3eb;
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"out of memory","");
  local_1b0 = 0x3ec;
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"internal error","");
  local_188 = 1;
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"optimal","");
  local_160 = 2;
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"imprecise","");
  local_138 = 3;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"primal infeas","");
  local_110 = 4;
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"dual infeas","");
  local_e8 = 6;
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"time limit","");
  local_c0 = 7;
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"iter limit","");
  local_98 = 8;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"no progress","");
  local_70 = 9;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"failed","");
  local_48 = 10;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"debug","");
  __l._M_len = 0xf;
  __l._M_array = (iterator)local_278;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_2a8,__l,&local_2a9,&local_2aa);
  lVar7 = 0;
  do {
    if (local_30 + lVar7 != *(undefined1 **)((long)local_40 + lVar7)) {
      operator_delete(*(undefined1 **)((long)local_40 + lVar7));
    }
    lVar7 = lVar7 + -0x28;
  } while (lVar7 != -600);
  if (local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_2a8._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      p_Var5 = local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 = p_Var4;
      _Var2 = p_Var5[1]._M_color;
      iVar6 = (int)this;
      p_Var4 = p_Var5;
      if ((int)_Var2 < iVar6) {
        p_Var4 = p_Var3;
      }
      local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent =
           (&p_Var5->_M_left)[(int)_Var2 < iVar6];
    } while ((&p_Var5->_M_left)[(int)_Var2 < iVar6] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      if ((int)_Var2 < iVar6) {
        p_Var5 = p_Var3;
      }
      if ((int)p_Var5[1]._M_color <= iVar6) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,p_Var4[1]._M_parent,
                   (long)&(p_Var4[1]._M_parent)->_M_color + (long)&(p_Var4[1]._M_left)->_M_color);
        goto LAB_003996fe;
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"unknown","");
LAB_003996fe:
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2a8);
  return __return_storage_ptr__;
}

Assistant:

std::string StatusString(Int status) {
    const std::map<int,std::string> status_name = {
        {IPX_STATUS_not_run, "not run"},
        {IPX_STATUS_solved, "solved"},
        {IPX_STATUS_stopped, "stopped"},
        {IPX_STATUS_no_model, "no model"},
        {IPX_STATUS_out_of_memory, "out of memory"},
        {IPX_STATUS_internal_error, "internal error"},
        {IPX_STATUS_optimal, "optimal"},
        {IPX_STATUS_imprecise, "imprecise"},
        {IPX_STATUS_primal_infeas, "primal infeas"},
        {IPX_STATUS_dual_infeas, "dual infeas"},
        {IPX_STATUS_time_limit, "time limit"},
        {IPX_STATUS_iter_limit, "iter limit"},
        {IPX_STATUS_no_progress, "no progress"},
        {IPX_STATUS_failed, "failed"},
        {IPX_STATUS_debug, "debug"}
    };
    auto entry = status_name.find(status);
    if (entry != status_name.end())
        return entry->second;
    return "unknown";
}